

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlNodeSetBase(xmlNodePtr cur,xmlChar *uri)

{
  xmlElementType xVar1;
  xmlChar *pxVar2;
  xmlNsPtr ns;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  xVar1 = cur->type;
  if (xVar1 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) {
    if ((0x1fddf8U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
      return;
    }
    if ((0x2200U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
      if (cur[1].name != (xmlChar *)0x0) {
        (*xmlFree)(cur[1].name);
      }
      if (uri == (xmlChar *)0x0) {
        pxVar2 = (xmlChar *)0x0;
      }
      else {
        pxVar2 = xmlPathToURI(uri);
      }
      cur[1].name = pxVar2;
      return;
    }
  }
  ns = xmlSearchNsByHref(cur->doc,cur,(xmlChar *)"http://www.w3.org/XML/1998/namespace");
  if (ns == (xmlNsPtr)0x0) {
    return;
  }
  pxVar2 = xmlPathToURI(uri);
  if (pxVar2 == (xmlChar *)0x0) {
    xmlSetNsProp(cur,ns,"base",uri);
    return;
  }
  xmlSetNsProp(cur,ns,"base",pxVar2);
  (*xmlFree)(pxVar2);
  return;
}

Assistant:

void
xmlNodeSetBase(xmlNodePtr cur, const xmlChar* uri) {
    xmlNsPtr ns;
    xmlChar* fixed;

    if (cur == NULL) return;
    switch(cur->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_COMMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_PI_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
	case XML_NAMESPACE_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    return;
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE: {
	    xmlDocPtr doc = (xmlDocPtr) cur;

	    if (doc->URL != NULL)
		xmlFree((xmlChar *) doc->URL);
	    if (uri == NULL)
		doc->URL = NULL;
	    else
		doc->URL = xmlPathToURI(uri);
	    return;
	}
    }

    ns = xmlSearchNsByHref(cur->doc, cur, XML_XML_NAMESPACE);
    if (ns == NULL)
	return;
    fixed = xmlPathToURI(uri);
    if (fixed != NULL) {
	xmlSetNsProp(cur, ns, BAD_CAST "base", fixed);
	xmlFree(fixed);
    } else {
	xmlSetNsProp(cur, ns, BAD_CAST "base", uri);
    }
}